

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_encryptor.h
# Opt level: O0

void __thiscall cppcms::sessions::impl::hmac_factory::~hmac_factory(hmac_factory *this)

{
  encryptor_factory *in_RDI;
  
  in_RDI->_vptr_encryptor_factory = (_func_int **)&PTR_get_0052f260;
  crypto::key::~key((key *)0x43781a);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  encryptor_factory::~encryptor_factory(in_RDI);
  return;
}

Assistant:

virtual ~hmac_factory() {}